

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextures
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  HLSL2GLSLConverterImpl *pHVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  HLSLObjectInfo *pHVar4;
  const_iterator cVar5;
  _List_node_base *p_Var6;
  iterator TmpToken;
  HashMapStringKey local_40;
  
  p_Var2 = ScopeStart->_M_node;
LAB_002993a6:
  p_Var6 = p_Var2;
  if (p_Var6 == ScopeEnd->_M_node) {
    return;
  }
  if ((*(int *)&p_Var6[1]._M_next == 0x13b) &&
     (pHVar4 = FindHLSLObject(this,(String *)&p_Var6[1]._M_prev), pHVar4 != (HLSLObjectInfo *)0x0))
  goto code_r0x002993cd;
  goto LAB_00299445;
code_r0x002993cd:
  pHVar1 = this->m_Converter;
  HashMapStringKey::HashMapStringKey(&local_40,(pHVar4->GLSLType)._M_dataplus._M_p,false);
  cVar5 = std::
          _Hashtable<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(pHVar1->m_ImageTypes)._M_h,&local_40);
  HashMapStringKey::Clear(&local_40);
  if ((cVar5.super__Node_iterator_base<Diligent::HashMapStringKey,_false>._M_cur ==
       (__node_type *)0x0) ||
     ((local_40.Str = (Char *)p_Var6,
      bVar3 = ProcessRWTextureStore(this,(iterator *)&local_40,ScopeEnd,pHVar4->ArrayDim),
      p_Var2 = (_List_node_base *)local_40.Str, !bVar3 &&
      (local_40.Str = (Char *)p_Var6,
      bVar3 = ProcessRWTextureLoad(this,(iterator *)&local_40,ScopeEnd,pHVar4->ArrayDim),
      p_Var2 = (_List_node_base *)local_40.Str, !bVar3)))) {
LAB_00299445:
    p_Var2 = p_Var6->_M_next;
  }
  goto LAB_002993a6;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextures(const TokenListType::iterator& ScopeStart,
                                                                 const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        if (Token->Type == TokenType::Identifier)
        {
            // Try to find the object in all scopes
            const auto* pObjectInfo = FindHLSLObject(Token->Literal);
            if (pObjectInfo == nullptr)
            {
                ++Token;
                continue;
            }

            // Check if the object is image type
            auto ImgTypeIt = m_Converter.m_ImageTypes.find(pObjectInfo->GLSLType.c_str());
            if (ImgTypeIt == m_Converter.m_ImageTypes.end())
            {
                ++Token;
                continue;
            }

            {
                // Handle store first. If this is not a store operation,
                // ProcessRWTextureStore() returns false.
                auto TmpToken = Token;
                if (ProcessRWTextureStore(TmpToken, ScopeEnd, pObjectInfo->ArrayDim))
                {
                    Token = TmpToken;
                    continue;
                }
            }

            {
                // Handle load.
                auto TmpToken = Token;
                if (ProcessRWTextureLoad(TmpToken, ScopeEnd, pObjectInfo->ArrayDim))
                {
                    Token = TmpToken;
                    continue;
                }
            }

            ++Token;
        }
        else
            ++Token;
    }
}